

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O2

bool crnlib::file_utils::split_path(char *p,dynamic_string *path,dynamic_string *filename)

{
  bool bVar1;
  char *pB;
  char *pA;
  dynamic_string temp_ext;
  dynamic_string temp_path;
  dynamic_string temp_drive;
  dynamic_string local_48;
  dynamic_string local_38;
  dynamic_string local_28;
  
  local_28.m_buf_size = 0;
  local_28.m_len = 0;
  local_28.m_pStr = (char *)0x0;
  local_38.m_buf_size = 0;
  local_38.m_len = 0;
  local_38.m_pStr = (char *)0x0;
  local_48.m_buf_size = 0;
  local_48.m_len = 0;
  local_48.m_pStr = (char *)0x0;
  bVar1 = split_path(p,&local_28,&local_38,filename,&local_48);
  if (bVar1) {
    dynamic_string::append(filename,&local_48);
    pA = local_28.m_pStr;
    if (local_28.m_pStr == (char *)0x0) {
      pA = "";
    }
    pB = local_38.m_pStr;
    if (local_38.m_pStr == (char *)0x0) {
      pB = "";
    }
    combine_path(path,pA,pB);
  }
  dynamic_string::~dynamic_string(&local_48);
  dynamic_string::~dynamic_string(&local_38);
  dynamic_string::~dynamic_string(&local_28);
  return bVar1;
}

Assistant:

bool file_utils::split_path(const char* p, dynamic_string& path, dynamic_string& filename)
    {
        dynamic_string temp_drive, temp_path, temp_ext;
        if (!split_path(p, &temp_drive, &temp_path, &filename, &temp_ext))
        {
            return false;
        }

        filename += temp_ext;

        combine_path(path, temp_drive.get_ptr(), temp_path.get_ptr());
        return true;
    }